

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O1

void duckdb::ArrowListData<int>::AppendOffsets
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to,
               vector<unsigned_int,_true> *child_sel)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  long lVar5;
  iterator __position;
  uint uVar6;
  reference this;
  long lVar7;
  InvalidInputException *this_00;
  idx_t iVar8;
  int params_1;
  idx_t iVar9;
  string local_50;
  
  this = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,1);
  iVar8 = this->count + (to - from) * 4 + 4;
  ArrowBuffer::reserve(this,iVar8);
  this->count = iVar8;
  pdVar1 = format->data;
  pdVar2 = this->dataptr;
  iVar8 = append_data->row_count;
  if (iVar8 == 0) {
    pdVar2[0] = '\0';
    pdVar2[1] = '\0';
    pdVar2[2] = '\0';
    pdVar2[3] = '\0';
  }
  if (from < to) {
    params_1 = *(int *)(pdVar2 + iVar8 * 4);
    iVar8 = from;
    do {
      psVar3 = format->sel->sel_vector;
      iVar9 = iVar8;
      if (psVar3 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar3[iVar8];
      }
      lVar7 = append_data->row_count + (iVar8 - from) + 1;
      puVar4 = (format->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((puVar4[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
        lVar5 = *(long *)(pdVar1 + iVar9 * 0x10 + 8);
        if ((params_1 + lVar5 & 0xffffffff80000000U) != 0) {
          this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Arrow Appender: The maximum combined list offset for regular list buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list buffers"
                     ,"");
          InvalidInputException::InvalidInputException<int,int>
                    (this_00,&local_50,0x7fffffff,params_1);
          __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        params_1 = (int)(params_1 + lVar5);
        *(int *)(pdVar2 + lVar7 * 4) = params_1;
        if (lVar5 != 0) {
          lVar7 = 0;
          do {
            uVar6 = (int)*(undefined8 *)(pdVar1 + iVar9 * 0x10) + (int)lVar7;
            local_50._M_dataplus._M_p._0_4_ = uVar6;
            __position._M_current =
                 (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                         __position,(uint *)&local_50);
            }
            else {
              *__position._M_current = uVar6;
              (child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
      }
      else {
        *(int *)(pdVar2 + lVar7 * 4) = params_1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != to);
  }
  return;
}

Assistant:

static void AppendOffsets(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to,
	                          vector<sel_t> &child_sel) {
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		idx_t size = to - from;
		auto &main_buffer = append_data.GetMainBuffer();

		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<list_entry_t>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// set up the offsets using the list entries
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				offset_data[offset_idx] = last_offset;
				continue;
			}

			// append the offset data
			auto list_length = data[source_idx].length;
			if (std::is_same<BUFTYPE, int32_t>::value == true &&
			    (uint64_t)last_offset + list_length > NumericLimits<int32_t>::Maximum()) {
				throw InvalidInputException(
				    "Arrow Appender: The maximum combined list offset for regular list buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), last_offset);
			}
			last_offset += list_length;
			offset_data[offset_idx] = last_offset;

			for (idx_t k = 0; k < list_length; k++) {
				child_sel.push_back(UnsafeNumericCast<sel_t>(data[source_idx].offset + k));
			}
		}
	}